

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void finishgencycle(lua_State *L,global_State *g)

{
  GCObject **ppGVar1;
  
  ppGVar1 = correctgraylist(&g->grayagain);
  *ppGVar1 = g->weak;
  g->weak = (GCObject *)0x0;
  ppGVar1 = correctgraylist(ppGVar1);
  *ppGVar1 = g->allweak;
  g->allweak = (GCObject *)0x0;
  ppGVar1 = correctgraylist(ppGVar1);
  *ppGVar1 = g->ephemeron;
  g->ephemeron = (GCObject *)0x0;
  correctgraylist(ppGVar1);
  checkSizes(L,g);
  g->gcstate = '\0';
  if (g->gcemergency != '\0') {
    return;
  }
  callallpendingfinalizers(L);
  return;
}

Assistant:

static void finishgencycle (lua_State *L, global_State *g) {
  correctgraylists(g);
  checkSizes(L, g);
  g->gcstate = GCSpropagate;  /* skip restart */
  if (!g->gcemergency)
    callallpendingfinalizers(L);
}